

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

GLuint impl_GLSL_LinkProgram(MOJOSHADER_glShader *vshader,MOJOSHADER_glShader *pshader)

{
  GLuint GVar1;
  GLhandleARB GVar2;
  GLint ok;
  GLsizei len_1;
  GLsizei len;
  GLint local_24;
  GLsizei local_20 [2];
  
  local_24 = 0;
  if (ctx->have_opengl_2 == 0) {
    GVar2 = (*ctx->glCreateProgramObjectARB)();
    if (vshader != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachObjectARB)(GVar2,vshader->handle);
    }
    if (pshader != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachObjectARB)(GVar2,pshader->handle);
    }
    (*ctx->glLinkProgramARB)(GVar2);
    (*ctx->glGetObjectParameterivARB)(GVar2,0x8b82,&local_24);
    if (local_24 != 0) {
      return GVar2;
    }
    local_20[0] = 0;
    (*ctx->glGetInfoLogARB)(GVar2,0x400,local_20,error_buffer);
    (*ctx->glDeleteObjectARB)(GVar2);
  }
  else {
    GVar1 = (*ctx->glCreateProgram)();
    if (vshader != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachShader)(GVar1,vshader->handle);
    }
    if (pshader != (MOJOSHADER_glShader *)0x0) {
      (*ctx->glAttachShader)(GVar1,pshader->handle);
    }
    (*ctx->glLinkProgram)(GVar1);
    (*ctx->glGetProgramiv)(GVar1,0x8b82,&local_24);
    if (local_24 != 0) {
      return GVar1;
    }
    local_20[1] = 0;
    (*ctx->glGetProgramInfoLog)(GVar1,0x400,local_20 + 1,error_buffer);
    (*ctx->glDeleteProgram)(GVar1);
  }
  return 0;
}

Assistant:

static GLuint impl_GLSL_LinkProgram(MOJOSHADER_glShader *vshader,
                                    MOJOSHADER_glShader *pshader)
{
    GLint ok = 0;

    if (ctx->have_opengl_2)
    {
        const GLuint program = ctx->glCreateProgram();

        if (vshader != NULL) ctx->glAttachShader(program, vshader->handle);
        if (pshader != NULL) ctx->glAttachShader(program, pshader->handle);

        ctx->glLinkProgram(program);

        ctx->glGetProgramiv(program, GL_LINK_STATUS, &ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetProgramInfoLog(program, sizeof (error_buffer),
                                     &len, (GLchar *) error_buffer);
            ctx->glDeleteProgram(program);
            return 0;
        } // if

        return program;
    } // if
    else
    {
        const GLhandleARB program = ctx->glCreateProgramObjectARB();
        assert(sizeof(program) == sizeof(GLuint));  // not always true on OS X!

        if (vshader != NULL)
            ctx->glAttachObjectARB(program, (GLhandleARB) vshader->handle);

        if (pshader != NULL)
            ctx->glAttachObjectARB(program, (GLhandleARB) pshader->handle);

        ctx->glLinkProgramARB(program);

        ctx->glGetObjectParameterivARB(program, GL_OBJECT_LINK_STATUS_ARB, &ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetInfoLogARB(program, sizeof (error_buffer),
                                 &len, (GLcharARB *) error_buffer);
            ctx->glDeleteObjectARB(program);
            return 0;
        } // if

        return (GLuint) program;
    } // else
}